

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.hpp
# Opt level: O0

Boxed_Value
chaiscript::bootstrap::ptr_assign<chaiscript::dispatch::Proxy_Function_Base>
          (Boxed_Value *lhs,shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *rhs)

{
  bool bVar1;
  Type_Info *this;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Boxed_Value BVar3;
  Boxed_Value *in_stack_ffffffffffffff38;
  Boxed_Value *in_stack_ffffffffffffff40;
  allocator *paVar4;
  string *in_stack_ffffffffffffff48;
  bad_boxed_cast *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  bool local_83;
  allocator local_81;
  string local_80 [128];
  
  bVar1 = Boxed_Value::is_undef((Boxed_Value *)0x36168e);
  local_83 = true;
  if (!bVar1) {
    this = Boxed_Value::get_type_info((Boxed_Value *)0x3616a5);
    bVar1 = Type_Info::is_const(this);
    in_stack_ffffffffffffff5f = false;
    local_83 = (bool)in_stack_ffffffffffffff5f;
    if (!bVar1) {
      in_stack_ffffffffffffff50 =
           (bad_boxed_cast *)Boxed_Value::get_type_info((Boxed_Value *)0x3616c4);
      chaiscript::detail::Get_Type_Info<chaiscript::dispatch::Proxy_Function_Base>::get();
      in_stack_ffffffffffffff5f =
           Type_Info::bare_equal
                     ((Type_Info *)in_stack_ffffffffffffff50,(Type_Info *)in_stack_ffffffffffffff48)
      ;
      local_83 = (bool)in_stack_ffffffffffffff5f;
    }
  }
  if (local_83 != false) {
    Boxed_Value::Boxed_Value<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&,void>
              (in_stack_ffffffffffffff40,
               (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)in_stack_ffffffffffffff38,
               false);
    Boxed_Value::assign((Boxed_Value *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58)
                        ,(Boxed_Value *)in_stack_ffffffffffffff50);
    Boxed_Value::~Boxed_Value((Boxed_Value *)0x361740);
    Boxed_Value::~Boxed_Value((Boxed_Value *)0x36174a);
    Boxed_Value::Boxed_Value(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = in_RDI;
    return (Boxed_Value)
           BVar3.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
  }
  uVar2 = __cxa_allocate_exception(0x48);
  paVar4 = &local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"type mismatch in pointer assignment",paVar4);
  exception::bad_boxed_cast::bad_boxed_cast(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  __cxa_throw(uVar2,&exception::bad_boxed_cast::typeinfo,exception::bad_boxed_cast::~bad_boxed_cast)
  ;
}

Assistant:

Boxed_Value ptr_assign(Boxed_Value lhs, const std::shared_ptr<Type> &rhs)
    {
      if (lhs.is_undef() 
          || (!lhs.get_type_info().is_const() && lhs.get_type_info().bare_equal(chaiscript::detail::Get_Type_Info<Type>::get())))
      {
        lhs.assign(Boxed_Value(rhs));
        return lhs;
      } else {
        throw exception::bad_boxed_cast("type mismatch in pointer assignment");
      }
    }